

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int-var-el.cpp
# Opt level: O0

void __thiscall IntVarEL::setBLearnable(IntVarEL *this,bool b)

{
  LitFlags *pLVar1;
  byte in_SIL;
  long in_RDI;
  int i;
  int local_10;
  
  for (local_10 = *(int *)(in_RDI + 0x60); local_10 <= *(int *)(in_RDI + 100) + 1;
      local_10 = local_10 + 1) {
    pLVar1 = vec<LitFlags>::operator[](&sat.flags,(*(int *)(in_RDI + 0x6c) + -1) / 2 + local_10);
    LitFlags::setLearnable(pLVar1,(bool)(in_SIL & 1));
    pLVar1 = vec<LitFlags>::operator[](&sat.flags,(*(int *)(in_RDI + 0x6c) + -1) / 2 + local_10);
    LitFlags::setUIPable(pLVar1,(bool)(in_SIL & 1));
  }
  return;
}

Assistant:

void IntVarEL::setBLearnable(bool b) const {
	for (int i = lit_min; i <= lit_max + 1; i++) {
		sat.flags[(base_blit - 1) / 2 + i].setLearnable(b);
		sat.flags[(base_blit - 1) / 2 + i].setUIPable(b);
	}
}